

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitSIMDShift(FunctionValidator *this,SIMDShift *curr)

{
  bool result;
  Module *pMVar1;
  Type local_48;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  SIMDShift *local_18;
  SIMDShift *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (SIMDShift *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasSIMD(&pMVar1->features);
  shouldBeTrue<wasm::SIMDShift*>
            (this,result,local_18,"SIMD operations require SIMD [--enable-simd]");
  local_20.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression.type
                .id;
  wasm::Type::Type(&local_28,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDShift*,wasm::Type>
            (this,local_20,local_28,local_18,"vector shift must have type v128");
  local_30.id = (local_18->vec->type).id;
  wasm::Type::Type(&local_38,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDShift*,wasm::Type>
            (this,local_30,local_38,local_18,"expected operand of type v128");
  local_40.id = (local_18->shift->type).id;
  wasm::Type::Type(&local_48,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDShift*,wasm::Type>
            (this,local_40,local_48,local_18,"expected shift amount to have type i32");
  return;
}

Assistant:

void FunctionValidator::visitSIMDShift(SIMDShift* curr) {
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::v128), curr, "vector shift must have type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->vec->type, Type(Type::v128), curr, "expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable(curr->shift->type,
                                    Type(Type::i32),
                                    curr,
                                    "expected shift amount to have type i32");
}